

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

int32_t __thiscall
icu_63::NFRule::findTextLenient
          (NFRule *this,UnicodeString *str,UnicodeString *key,int32_t startingAt,int32_t *length)

{
  undefined4 uVar1;
  undefined4 srcStart;
  UBool UVar2;
  int32_t iVar3;
  UErrorCode local_84;
  undefined1 local_80 [4];
  UErrorCode status;
  UnicodeString temp;
  int32_t keyLen;
  int32_t p;
  int32_t *length_local;
  int32_t startingAt_local;
  UnicodeString *key_local;
  UnicodeString *str_local;
  NFRule *this_local;
  
  temp.fUnion._48_4_ = 0;
  temp.fUnion._52_4_ = startingAt;
  UnicodeString::UnicodeString((UnicodeString *)local_80);
  local_84 = U_ZERO_ERROR;
  for (; uVar1 = temp.fUnion._52_4_, iVar3 = UnicodeString::length(str),
      srcStart = temp.fUnion._52_4_, (int)uVar1 < iVar3 && temp.fUnion._48_4_ == 0;
      temp.fUnion._52_4_ = temp.fUnion._52_4_ + 1) {
    iVar3 = UnicodeString::length(str);
    UnicodeString::setTo((UnicodeString *)local_80,str,srcStart,iVar3 - temp.fUnion._52_4_);
    temp.fUnion._48_4_ = prefixLength(this,(UnicodeString *)local_80,key,&local_84);
    UVar2 = ::U_FAILURE(local_84);
    if (UVar2 != '\0') break;
    if (temp.fUnion._48_4_ != 0) {
      *length = temp.fUnion._48_4_;
      this_local._4_4_ = temp.fUnion._52_4_;
      goto LAB_002d0cf4;
    }
  }
  *length = 0;
  this_local._4_4_ = -1;
LAB_002d0cf4:
  UnicodeString::~UnicodeString((UnicodeString *)local_80);
  return this_local._4_4_;
}

Assistant:

int32_t
NFRule::findTextLenient(const UnicodeString& str,
                 const UnicodeString& key,
                 int32_t startingAt,
                 int32_t* length) const
{
    //----------------------------------------------------------------
    // JDK 1.1 HACK (take out of 1.2-specific code)

    // in JDK 1.2, CollationElementIterator provides us with an
    // API to map between character offsets and collation elements
    // and we can do this by marching through the string comparing
    // collation elements.  We can't do that in JDK 1.1.  Insted,
    // we have to go through this horrible slow mess:
    int32_t p = startingAt;
    int32_t keyLen = 0;

    // basically just isolate smaller and smaller substrings of
    // the target string (each running to the end of the string,
    // and with the first one running from startingAt to the end)
    // and then use prefixLength() to see if the search key is at
    // the beginning of each substring.  This is excruciatingly
    // slow, but it will locate the key and tell use how long the
    // matching text was.
    UnicodeString temp;
    UErrorCode status = U_ZERO_ERROR;
    while (p < str.length() && keyLen == 0) {
        temp.setTo(str, p, str.length() - p);
        keyLen = prefixLength(temp, key, status);
        if (U_FAILURE(status)) {
            break;
        }
        if (keyLen != 0) {
            *length = keyLen;
            return p;
        }
        ++p;
    }
    // if we make it to here, we didn't find it.  Return -1 for the
    // location.  The length should be ignored, but set it to 0,
    // which should be "safe"
    *length = 0;
    return -1;
}